

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void * hash_table_new_item(hash_table_t *table,void *key)

{
  size_t sVar1;
  undefined8 *puVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  hash_table_bucket_t *phVar6;
  hash_table_bucket_t *phVar7;
  void *pvVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  undefined8 *puVar15;
  undefined8 uVar16;
  ulong uVar17;
  ulong __nmemb;
  hash_table_bucket_t **pphVar18;
  uint uVar19;
  uint uVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  dVar21 = ((double)table->n_items + 1.0) / (double)table->n_buckets;
  if (table->max_load <= dVar21 && dVar21 != table->max_load) {
    hash_table_increase_buckets(table);
  }
  iVar14 = 0;
  do {
    sVar1 = (table->ghash).mult;
    sVar5 = (*table->hash)(key);
    pphVar18 = &table->buckets
                [sVar5 * sVar1 + (table->ghash).add >> (-(char)(table->ghash).log2_buckets & 0x3fU)
                 & 0xffffffff].next;
    phVar6 = *pphVar18;
    if (phVar6 == (hash_table_bucket_t *)0x0) goto LAB_00111b12;
    uVar19 = 0;
    do {
      iVar3 = (*table->is_equal)(key,phVar6->data);
      if (iVar3 != 0) goto LAB_00111b91;
      uVar19 = uVar19 + 1;
      phVar6 = (*pphVar18)->next;
      pphVar18 = &(*pphVar18)->next;
    } while (phVar6 != (hash_table_bucket_t *)0x0);
    if (uVar19 <= table->max_collisions) goto LAB_00111b12;
    hash_table_increase_buckets(table);
    iVar14 = iVar14 + 1;
  } while (iVar14 != 5);
  hash_table_new_item_cold_1();
LAB_00111b12:
  phVar6 = table->free_buckets;
  if (phVar6 == (hash_table_bucket_t *)0x0) {
    uVar19 = table->n_buckets;
    __nmemb = (ulong)uVar19;
    phVar7 = (hash_table_bucket_t *)calloc(__nmemb,0x10);
    if (phVar7 == (hash_table_bucket_t *)0x0) {
      hash_table_new_item_cold_2();
      uVar19 = *(uint *)(__nmemb + 4);
      uVar11 = (ulong)uVar19;
      if (uVar19 == 0) {
        __assert_fail("table->n_buckets > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/util.c"
                      ,0xfe,"void hash_table_increase_buckets(hash_table_t *)");
      }
      uVar10 = (ulong)(uVar19 * 2 + 1);
      uVar16 = 0x10;
      pvVar8 = calloc(uVar10,0x10);
      if (pvVar8 == (void *)0x0) {
        hash_table_increase_buckets_cold_1();
        lVar12 = *(long *)(uVar10 + 0x38);
        lVar9 = (**(code **)(uVar10 + 0x28))(uVar16);
        puVar15 = *(undefined8 **)
                   (*(long *)(uVar10 + 8) + 8 +
                   ((ulong)(lVar9 * lVar12 + *(long *)(uVar10 + 0x40)) >>
                    (-*(char *)(uVar10 + 0x48) & 0x3fU) & 0xffffffff) * 0x10);
        while( true ) {
          if (puVar15 == (undefined8 *)0x0) {
            return (void *)0x0;
          }
          iVar14 = (**(code **)(uVar10 + 0x20))(uVar16,*puVar15);
          if (iVar14 != 0) break;
          puVar15 = (undefined8 *)puVar15[1];
        }
        return (void *)*puVar15;
      }
      *(undefined8 *)((long)pvVar8 + 8) = *(undefined8 *)(__nmemb + 0x18);
      *(void **)(__nmemb + 0x18) = pvVar8;
      lVar12 = *(long *)(__nmemb + 0x30) * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
      auVar22._8_4_ = (int)((ulong)lVar12 >> 0x20);
      auVar22._0_8_ = lVar12;
      auVar22._12_4_ = 0x45300000;
      dVar21 = ((auVar22._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0)) *
               5.421010862427522e-20 * 1.8446744073709552e+19;
      uVar17 = (ulong)dVar21;
      uVar17 = (long)(dVar21 - 9.223372036854776e+18) & (long)uVar17 >> 0x3f | uVar17;
      lVar12 = lVar12 * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
      auVar23._8_4_ = (int)((ulong)lVar12 >> 0x20);
      auVar23._0_8_ = lVar12;
      auVar23._12_4_ = 0x45300000;
      dVar21 = ((auVar23._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0)) *
               5.421010862427522e-20 * 1.8446744073709552e+19;
      uVar10 = (ulong)dVar21;
      *(long *)(__nmemb + 0x30) = lVar12;
      uVar10 = (long)(dVar21 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f | uVar10;
      uVar4 = uint32_log2(uVar19 * 2);
      uVar13 = 0;
      do {
        puVar15 = *(undefined8 **)(*(long *)(__nmemb + 8) + 8 + uVar13 * 0x10);
        if (puVar15 != (undefined8 *)0x0) {
          do {
            puVar2 = (undefined8 *)puVar15[1];
            lVar12 = (**(code **)(__nmemb + 0x28))(*puVar15);
            lVar12 = (lVar12 * uVar17 + uVar10 >> (0x40U - (char)uVar4 & 0x3f) & 0xffffffff) * 0x10;
            puVar15[1] = *(undefined8 *)((long)pvVar8 + lVar12 + 0x18);
            *(undefined8 **)((long)pvVar8 + lVar12 + 0x18) = puVar15;
            puVar15 = puVar2;
          } while (puVar2 != (undefined8 *)0x0);
          uVar11 = (ulong)*(uint *)(__nmemb + 4);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < uVar11);
      puVar15 = *(undefined8 **)(__nmemb + 8);
      uVar20 = (int)uVar11 - 1;
      if (uVar20 == 0) {
        uVar11 = 0;
      }
      else {
        uVar11 = (ulong)uVar20;
        uVar13 = uVar11;
        puVar2 = puVar15;
        do {
          puVar2[1] = puVar2 + 2;
          *puVar2 = 0;
          uVar13 = uVar13 - 1;
          puVar2 = puVar2 + 2;
        } while (uVar13 != 0);
      }
      puVar15[uVar11 * 2 + 1] = *(undefined8 *)(__nmemb + 0x10);
      puVar15[uVar11 * 2] = 0;
      *(undefined8 **)(__nmemb + 0x10) = puVar15;
      *(long *)(__nmemb + 8) = (long)pvVar8 + 0x10;
      *(uint *)(__nmemb + 4) = uVar19 * 2;
      *(ulong *)(__nmemb + 0x38) = uVar17;
      *(ulong *)(__nmemb + 0x40) = uVar10;
      *(uint *)(__nmemb + 0x48) = uVar4;
      return (void *)(ulong)uVar4;
    }
    phVar7->next = table->allocs;
    table->allocs = phVar7;
    uVar19 = uVar19 - 1;
    if (1 < uVar19) {
      phVar6 = phVar7 + 2;
      lVar12 = (ulong)uVar19 - 1;
      do {
        phVar6[-1].next = phVar6;
        phVar6[-1].data = (void *)0x0;
        phVar6 = phVar6 + 1;
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
    }
    phVar6 = phVar7 + 1;
    phVar7[uVar19].data = (void *)0x0;
    phVar7[uVar19].next = (hash_table_bucket_t *)0x0;
  }
  table->free_buckets = phVar6->next;
  phVar6->next = (hash_table_bucket_t *)0x0;
  *pphVar18 = phVar6;
  phVar6->data = key;
  table->n_items = table->n_items + 1;
LAB_00111b91:
  return (*pphVar18)->data;
}

Assistant:

void * hash_table_new_item( hash_table_t * table, void * key )
{
    int try;
    double load = (table->n_items + 1.0)/table->n_buckets;
    hash_table_bucket_t ** b;
    hash_table_bucket_t * new_bucket;

    if (load > table->max_load)
        hash_table_increase_buckets( table );

    for ( try = 0; try < 5; ++try ) {
        unsigned collisions = 0;
        unsigned i = (unsigned) hash( table->ghash, (* table->hash )( key ) );
        b = & table->buckets[i].next;
        
        while (*b) {
            if ( (*table->is_equal)(key, (*b)->data) )
                return (*b)->data;
            collisions += 1;
            b = &(*b)->next;
        }

        if ( collisions > table->max_collisions ) 
            hash_table_increase_buckets( table );
        else
            goto found_item;
    }

    fprintf(stderr, "hash_table_new_item: Beaten by the odds; "
            "too many rehashes\n");
    abort();

found_item:

    if ( table->free_buckets == NULL )
        hash_table_increase_free_buckets( table );

    /* pop a free bucket from the free list */
    new_bucket = table->free_buckets;
    table->free_buckets = table->free_buckets->next;
    new_bucket->next = NULL;
    new_bucket->data = NULL;

    /* append it to the end of the bucket list */
    *b = new_bucket;
    (*b)->data = key;
    table->n_items += 1;
    return (*b)->data;
}